

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_mem.c
# Opt level: O0

void * amqp_pool_alloc(amqp_pool_t *pool,size_t amount)

{
  int iVar1;
  amqp_pool_blocklist_t *x;
  void *pvVar2;
  long in_RSI;
  ulong *in_RDI;
  void *result_1;
  void *result;
  void *in_stack_ffffffffffffffe0;
  void *local_8;
  
  if (in_RSI == 0) {
    local_8 = (void *)0x0;
  }
  else {
    x = (amqp_pool_blocklist_t *)(in_RSI + 7U & 0xfffffffffffffff8);
    if ((amqp_pool_blocklist_t *)*in_RDI < x) {
      local_8 = calloc(1,(size_t)x);
      if (local_8 == (void *)0x0) {
        local_8 = (void *)0x0;
      }
      else {
        iVar1 = record_pool_block(x,local_8);
        if (iVar1 == 0) {
          local_8 = (void *)0x0;
        }
      }
    }
    else if ((in_RDI[6] == 0) || (*in_RDI < (long)&x->num_blocks + in_RDI[7])) {
      if ((int)in_RDI[5] < (int)in_RDI[1]) {
        in_RDI[6] = *(ulong *)(in_RDI[2] + (long)(int)in_RDI[5] * 8);
        *(int *)(in_RDI + 5) = (int)in_RDI[5] + 1;
      }
      else {
        pvVar2 = calloc(1,*in_RDI);
        in_RDI[6] = (ulong)pvVar2;
        if (in_RDI[6] == 0) {
          return (void *)0x0;
        }
        iVar1 = record_pool_block(x,in_stack_ffffffffffffffe0);
        if (iVar1 == 0) {
          return (void *)0x0;
        }
        *(int *)(in_RDI + 5) = (int)in_RDI[1];
      }
      in_RDI[7] = (ulong)x;
      local_8 = (void *)in_RDI[6];
    }
    else {
      local_8 = (void *)(in_RDI[6] + in_RDI[7]);
      in_RDI[7] = (long)&x->num_blocks + in_RDI[7];
    }
  }
  return local_8;
}

Assistant:

void *amqp_pool_alloc(amqp_pool_t *pool, size_t amount)
{
  if (amount == 0) {
    return NULL;
  }

  amount = (amount + 7) & (~7); /* round up to nearest 8-byte boundary */

  if (amount > pool->pagesize) {
    void *result = calloc(1, amount);
    if (result == NULL) {
      return NULL;
    }
    if (!record_pool_block(&pool->large_blocks, result)) {
      return NULL;
    }
    return result;
  }

  if (pool->alloc_block != NULL) {
    assert(pool->alloc_used <= pool->pagesize);

    if (pool->alloc_used + amount <= pool->pagesize) {
      void *result = pool->alloc_block + pool->alloc_used;
      pool->alloc_used += amount;
      return result;
    }
  }

  if (pool->next_page >= pool->pages.num_blocks) {
    pool->alloc_block = calloc(1, pool->pagesize);
    if (pool->alloc_block == NULL) {
      return NULL;
    }
    if (!record_pool_block(&pool->pages, pool->alloc_block)) {
      return NULL;
    }
    pool->next_page = pool->pages.num_blocks;
  } else {
    pool->alloc_block = pool->pages.blocklist[pool->next_page];
    pool->next_page++;
  }

  pool->alloc_used = amount;

  return pool->alloc_block;
}